

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionFlowElementType::IfcDistributionFlowElementType
          (IfcDistributionFlowElementType *this)

{
  *(undefined ***)&(this->super_IfcDistributionElementType).field_0x1a0 = &PTR__Object_007331c0;
  *(undefined8 *)&this->field_0x1a8 = 0;
  *(char **)&this->field_0x1b0 = "IfcDistributionFlowElementType";
  IfcDistributionElementType::IfcDistributionElementType
            (&this->super_IfcDistributionElementType,&PTR_construction_vtable_24__00734a28);
  *(undefined8 *)
   &(this->super_IfcDistributionElementType).super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject = 0x7348f8;
  *(undefined8 *)&(this->super_IfcDistributionElementType).field_0x1a0 = 0x734a10;
  *(undefined8 *)
   &(this->super_IfcDistributionElementType).super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject.field_0x88 = 0x734920;
  (this->super_IfcDistributionElementType).super_IfcElementType.super_IfcTypeProduct.
  super_IfcTypeObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x734948;
  *(undefined8 *)
   &(this->super_IfcDistributionElementType).super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject.field_0xf0 = 0x734970;
  *(undefined8 *)
   &(this->super_IfcDistributionElementType).super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0x734998;
  *(undefined8 *)&(this->super_IfcDistributionElementType).super_IfcElementType.field_0x180 =
       0x7349c0;
  *(undefined8 *)&(this->super_IfcDistributionElementType).super_IfcElementType.field_0x190 =
       0x7349e8;
  return;
}

Assistant:

IfcDistributionFlowElementType() : Object("IfcDistributionFlowElementType") {}